

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O2

void __thiscall OpenMD::SC::calcForce(SC *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  long lVar5;
  pointer pSVar6;
  long lVar7;
  pointer pSVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  RealType rhtmp;
  RealType drhodr;
  RealType dvpdr;
  RealType vptmp;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar4 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar4[idat->atid1];
  lVar7 = (long)piVar4[idat->atid2];
  lVar9 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].
                    super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = lVar7 * 0x48;
  dVar11 = *(double *)(lVar9 + 0x20 + lVar5);
  if (idat->rij <= dVar11 && dVar11 != idat->rij) {
    pSVar8 = (this->SCdata).
             super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = lVar9 + lVar5;
    dVar11 = *(double *)(lVar9 + 0x28);
    CubicSpline::getValueAndDerivativeAt
              (*(CubicSpline **)(lVar9 + 0x38),&idat->rij,&local_80,&local_78);
    CubicSpline::getValueAndDerivativeAt
              (*(CubicSpline **)(lVar9 + 0x30),&idat->rij,&local_68,&local_70);
    dVar11 = local_68 - dVar11;
    idat->vpair = idat->vpair + dVar11;
    operator*(&local_60,&(idat->d).super_Vector<double,_3U>,
              (idat->dfrho1 + idat->dfrho2) * local_78 + local_70);
    operator/(&local_48,&local_60,idat->rij);
    Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_48);
    if (idat->doParticlePot == true) {
      pSVar6 = pSVar8 + lVar7;
      dVar1 = pSVar6->c;
      dVar2 = pSVar6->epsilon;
      dVar10 = idat->rho2 - local_80;
      pSVar8 = pSVar8 + iVar3;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      idat->particlePot1 = idat->particlePot1 - (dVar1 * dVar2 * dVar10 + idat->frho2);
      dVar1 = pSVar8->c;
      dVar2 = pSVar8->epsilon;
      local_80 = idat->rho1 - local_80;
      if (local_80 < 0.0) {
        local_80 = sqrt(local_80);
      }
      else {
        local_80 = SQRT(local_80);
      }
      idat->particlePot2 = idat->particlePot2 - (dVar1 * dVar2 * local_80 + idat->frho1);
    }
    (idat->pot).data_[4] = (idat->pot).data_[4] + dVar11;
    if (idat->isSelected == true) {
      (idat->selePot).data_[4] = dVar11 + (idat->selePot).data_[4];
    }
  }
  return;
}

Assistant:

void SC::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    int& sctid1 = SCtids[idat.atid1];
    int& sctid2 = SCtids[idat.atid2];

    SCAtomData& data1 = SCdata[sctid1];
    SCAtomData& data2 = SCdata[sctid2];

    SCInteractionData& mixer = MixingMap[sctid1][sctid2];

    RealType rcij = mixer.rCut;

    if (idat.rij < rcij) {
      RealType vcij = mixer.vCut;
      RealType rhtmp, drhodr, vptmp, dvpdr;

      mixer.phi->getValueAndDerivativeAt(idat.rij, rhtmp, drhodr);
      mixer.V->getValueAndDerivativeAt(idat.rij, vptmp, dvpdr);

      RealType pot_temp = vptmp - vcij;
      idat.vpair += pot_temp;

      RealType dudr = drhodr * (idat.dfrho1 + idat.dfrho2) + dvpdr;

      idat.f1 += idat.d * dudr / idat.rij;

      if (idat.doParticlePot) {
        // particlePot is the difference between the full potential and
        // the full potential without the presence of a particular
        // particle (atom1).
        //
        // This reduces the density at other particle locations, so we
        // need to recompute the density at atom2 assuming atom1 didn't
        // contribute.  This then requires recomputing the density
        // functional for atom2 as well.

        idat.particlePot1 -=
            data2.c * data2.epsilon * sqrt(idat.rho2 - rhtmp) + idat.frho2;

        idat.particlePot2 -=
            data1.c * data1.epsilon * sqrt(idat.rho1 - rhtmp) + idat.frho1;
      }

      idat.pot[METALLIC_PAIR_FAMILY] += pot_temp;

      if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += pot_temp;
    }

    return;
  }